

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O0

void ffcprs(ParseData *lParse)

{
  int iVar1;
  long in_RDI;
  int i;
  int node;
  int col;
  int local_10;
  int local_c;
  
  if (*(int *)(in_RDI + 0x60) < 1) {
    if (*(long *)(in_RDI + 0xa0) != 0) {
      if (*(long *)(in_RDI + 0xa0) == 0) {
        printf("invalid free(lParse->colData) at %s:%d\n",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
               ,0x3c7);
      }
      else {
        free(*(void **)(in_RDI + 0xa0));
      }
    }
  }
  else {
    if (*(long *)(in_RDI + 0xa0) == 0) {
      printf("invalid free(lParse->colData) at %s:%d\n",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
             ,0x3bc);
    }
    else {
      free(*(void **)(in_RDI + 0xa0));
    }
    for (local_c = 0; local_c < *(int *)(in_RDI + 0x60); local_c = local_c + 1) {
      if (*(long *)(*(long *)(in_RDI + 0xa8) + (long)local_c * 0xa0 + 0x90) != 0) {
        if (*(int *)(*(long *)(in_RDI + 0xa8) + (long)local_c * 0xa0 + 0x54) == 0x106) {
          if (**(long **)(*(long *)(in_RDI + 0xa8) + (long)local_c * 0xa0 + 0x98) == 0) {
            printf("invalid free(((char**)lParse->varData[col].data)[0]) at %s:%d\n",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                   ,0x3c0);
          }
          else {
            free((void *)**(undefined8 **)(*(long *)(in_RDI + 0xa8) + (long)local_c * 0xa0 + 0x98));
          }
        }
        free(*(void **)(*(long *)(in_RDI + 0xa8) + (long)local_c * 0xa0 + 0x90));
      }
    }
    if (*(long *)(in_RDI + 0xa8) == 0) {
      printf("invalid free(lParse->varData) at %s:%d\n",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
             ,0x3c3);
    }
    else {
      free(*(void **)(in_RDI + 0xa8));
    }
    *(undefined4 *)(in_RDI + 0x60) = 0;
  }
  if (0 < *(int *)(in_RDI + 0x40)) {
    local_10 = *(int *)(in_RDI + 0x40);
    while (iVar1 = local_10 + -1, local_10 != 0) {
      local_10 = iVar1;
      if (*(int *)(*(long *)(in_RDI + 0x38) + (long)iVar1 * 0x180) == 0x408) {
        iVar1 = *(int *)(*(long *)(in_RDI + 0x38) + (long)iVar1 * 0x180 + 0x14);
        if (*(long *)(*(long *)(in_RDI + 0x38) + (long)iVar1 * 0x180 + 0x80) != 0) {
          if (*(long *)(*(long *)(in_RDI + 0x38) + (long)iVar1 * 0x180 + 0x80) == 0) {
            printf("invalid free(lParse->Nodes[ i ].value.data.ptr) at %s:%d\n",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                   ,0x3d0);
          }
          else {
            free(*(void **)(*(long *)(in_RDI + 0x38) + (long)iVar1 * 0x180 + 0x80));
          }
        }
      }
      else if (*(int *)(*(long *)(in_RDI + 0x38) + (long)iVar1 * 0x180) == 0x409) {
        fits_free_region((SAORegion *)lParse);
      }
    }
    *(undefined4 *)(in_RDI + 0x40) = 0;
  }
  if (*(long *)(in_RDI + 0x38) != 0) {
    free(*(void **)(in_RDI + 0x38));
  }
  *(undefined8 *)(in_RDI + 0x38) = 0;
  *(undefined4 *)(in_RDI + 0xdc) = 0xffffffff;
  *(undefined8 *)(in_RDI + 0xb0) = 0;
  *(undefined8 *)(in_RDI + 0xd0) = 0;
  *(undefined8 *)(in_RDI + 0xc0) = 0;
  return;
}

Assistant:

void ffcprs( ParseData *lParse )
/*                                                                          */
/* Clear the parser, making it ready to accept a new expression.            */
/*--------------------------------------------------------------------------*/
{
   int col, node, i;

   if( lParse->nCols > 0 ) {
      FREE( lParse->colData  );
      for( col=0; col<lParse->nCols; col++ ) {
         if( lParse->varData[col].undef == NULL ) continue;
         if( lParse->varData[col].type  == BITSTR )
           FREE( ((char**)lParse->varData[col].data)[0] );
         free( lParse->varData[col].undef );
      }
      FREE( lParse->varData );
      lParse->nCols = 0;
   } else if ( lParse->colData ) {
     /* Special case if colData needed to be created with no columns */
     FREE( lParse->colData );
   }

   if( lParse->nNodes > 0 ) {
      node = lParse->nNodes;
      while( node-- ) {
         if( lParse->Nodes[node].operation==gtifilt_fct ) {
            i = lParse->Nodes[node].SubNodes[0];
            if (lParse->Nodes[ i ].value.data.ptr)
	        FREE( lParse->Nodes[ i ].value.data.ptr );
         }
         else if( lParse->Nodes[node].operation==regfilt_fct ) {
            i = lParse->Nodes[node].SubNodes[0];
            fits_free_region( (SAORegion *)lParse->Nodes[ i ].value.data.ptr );
         }
      }
      lParse->nNodes = 0;
   }
   if( lParse->Nodes ) free( lParse->Nodes );
   lParse->Nodes = NULL;

   lParse->hdutype = ANY_HDU;
   lParse->pixFilter = 0;
   lParse->nDataRows = lParse->nPrevDataRows = 0;
}